

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_pack_header(nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong __n;
  size_t namesize;
  undefined5 uStack_30;
  nvpair_header nvphdr;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  
  if (nvp == (nvpair_t *)0x0) {
    __assert_fail("(nvp) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x149,
                  "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)");
  }
  if (nvp->nvp_magic != 0x6e7670) {
    __assert_fail("(nvp)->nvp_magic == 0x6e7670",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x149,
                  "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)");
  }
  iVar1 = nvp->nvp_type;
  sVar3 = strlen(nvp->nvp_name);
  __n = sVar3 + 1;
  if ((__n == 0) || (0xffff < __n)) {
    __assert_fail("namesize > 0 && namesize <= (65535)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x14d,
                  "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)");
  }
  uStack_30 = (undefined5)nvp->nvp_datasize;
  nvphdr._0_3_ = SUB83(nvp->nvp_datasize >> 0x28,0);
  sVar2 = nvp->nvp_nitems;
  nvphdr.nvph_datasize._0_5_ = (undefined5)sVar2;
  nvphdr.nvph_datasize._5_2_ = (undefined2)(sVar2 >> 0x28);
  nvphdr.nvph_datasize._7_1_ = (uchar)(sVar2 >> 0x38);
  if (*leftp < 0x13) {
    __assert_fail("*leftp >= sizeof(nvphdr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x151,
                  "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)");
  }
  *(ulong *)ptr = CONCAT53(uStack_30,CONCAT21((short)__n,(char)iVar1));
  *(ulong *)(ptr + 8) = CONCAT53((undefined5)nvphdr.nvph_datasize,nvphdr._0_3_);
  *(undefined2 *)(ptr + 0x10) = nvphdr.nvph_datasize._5_2_;
  ptr[0x12] = nvphdr.nvph_datasize._7_1_;
  *leftp = *leftp - 0x13;
  if (__n <= *leftp) {
    memcpy(ptr + 0x13,nvp->nvp_name,__n);
    *leftp = *leftp - __n;
    return ptr + 0x13 + __n;
  }
  __assert_fail("*leftp >= namesize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x156,
                "unsigned char *nvpair_pack_header(const nvpair_t *, unsigned char *, size_t *)");
}

Assistant:

unsigned char *
nvpair_pack_header(const nvpair_t *nvp, unsigned char *ptr, size_t *leftp)
{
	struct nvpair_header nvphdr;
	size_t namesize;

	NVPAIR_ASSERT(nvp);

	nvphdr.nvph_type = nvp->nvp_type;
	namesize = strlen(nvp->nvp_name) + 1;
	PJDLOG_ASSERT(namesize > 0 && namesize <= UINT16_MAX);
	nvphdr.nvph_namesize = namesize;
	nvphdr.nvph_datasize = nvp->nvp_datasize;
	nvphdr.nvph_nitems = nvp->nvp_nitems;
	PJDLOG_ASSERT(*leftp >= sizeof(nvphdr));
	memcpy(ptr, &nvphdr, sizeof(nvphdr));
	ptr += sizeof(nvphdr);
	*leftp -= sizeof(nvphdr);

	PJDLOG_ASSERT(*leftp >= namesize);
	memcpy(ptr, nvp->nvp_name, namesize);
	ptr += namesize;
	*leftp -= namesize;

	return (ptr);
}